

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

thousands_sep_result<char> * fmt::v11::detail::thousands_sep_impl<char>(locale_ref loc)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  thousands_sep_result<char> *in_RDI;
  char thousands_sep;
  string grouping;
  numpunct<char> *facet;
  undefined6 in_stack_ffffffffffffff80;
  char in_stack_ffffffffffffff86;
  char cVar2;
  char cVar3;
  thousands_sep_result<char> *ptVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20;
  
  __str = &local_20;
  ptVar4 = in_RDI;
  locale_ref::get<std::locale>((locale_ref *)in_RDI);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::use_facet<std::__cxx11::numpunct<char>>((locale *)__str);
  std::locale::~locale((locale *)&local_20);
  local_20._M_string_length = (size_type)this;
  std::__cxx11::numpunct<char>::grouping();
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa641f3);
  if (bVar1) {
    cVar2 = '\0';
  }
  else {
    in_stack_ffffffffffffff86 = std::__cxx11::numpunct<char>::thousands_sep();
    cVar2 = in_stack_ffffffffffffff86;
  }
  cVar3 = cVar2;
  std::__cxx11::string::string(this,__str);
  ptVar4->thousands_sep = cVar2;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(cVar3,CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
  return in_RDI;
}

Assistant:

FMT_FUNC auto thousands_sep_impl(locale_ref loc) -> thousands_sep_result<Char> {
  auto&& facet = use_facet<numpunct<Char>>(loc.get<locale>());
  auto grouping = facet.grouping();
  auto thousands_sep = grouping.empty() ? Char() : facet.thousands_sep();
  return {std::move(grouping), thousands_sep};
}